

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS
ref_geom_support_between(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *needs_support)

{
  int iVar1;
  REF_GEOM pRVar2;
  REF_ADJ pRVar3;
  REF_INT *pRVar4;
  uint uVar5;
  REF_ADJ_ITEM pRVar6;
  ulong uVar7;
  long lVar8;
  REF_BOOL has_id;
  int local_54;
  REF_BOOL *local_50;
  ulong local_48;
  long local_40;
  REF_GRID local_38;
  
  pRVar2 = ref_grid->geom;
  *needs_support = 0;
  if (((-1 < node0) && (pRVar3 = pRVar2->ref_adj, node0 < pRVar3->nnode)) &&
     (local_40 = (long)pRVar3->first[(uint)node0], local_40 != -1)) {
    pRVar6 = pRVar3->item + local_40;
    uVar7 = (ulong)(uint)node1;
    local_50 = needs_support;
    local_48 = uVar7;
    local_38 = ref_grid;
    while( true ) {
      if (((node1 < 0) || (pRVar3 = pRVar2->ref_adj, pRVar3->nnode <= node1)) ||
         (lVar8 = (long)pRVar3->first[uVar7], lVar8 == -1)) {
        pRVar6 = pRVar2->ref_adj->item;
      }
      else {
        iVar1 = pRVar6->ref;
        pRVar6 = pRVar3->item + lVar8;
        while( true ) {
          pRVar4 = pRVar2->descr;
          if (((pRVar4[(long)iVar1 * 6] == 2) && (pRVar4[(long)pRVar6->ref * 6] == 2)) &&
             (pRVar4[iVar1 * 6 + 1] == pRVar4[(int)(pRVar6->ref * 6 | 1)])) {
            uVar5 = ref_cell_side_has_id
                              (local_38->cell[3],node0,node1,pRVar4[iVar1 * 6 + 1],&local_54);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x5b2,"ref_geom_support_between",(ulong)uVar5,"has edge id");
              return uVar5;
            }
            if (local_54 != 0) {
              *local_50 = 1;
              return 0;
            }
          }
          pRVar6 = pRVar2->ref_adj->item;
          lVar8 = (long)pRVar6[(int)lVar8].next;
          uVar7 = local_48;
          if (lVar8 == -1) break;
          pRVar6 = pRVar6 + lVar8;
        }
      }
      local_40 = (long)pRVar6[(int)local_40].next;
      if (local_40 == -1) break;
      pRVar6 = pRVar6 + local_40;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_support_between(REF_GRID ref_grid, REF_INT node0,
                                            REF_INT node1,
                                            REF_BOOL *needs_support) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT item0, item1;
  REF_INT geom0, geom1;
  REF_INT type, id;
  REF_BOOL has_id;

  *needs_support = REF_FALSE;
  /* assume face check is sufficient */
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node0, item0, geom0)
      each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node1, item1,
                                      geom1) {
    type = REF_GEOM_FACE;
    if (ref_geom_type(ref_geom, geom0) == type &&
        ref_geom_type(ref_geom, geom1) == type &&
        ref_geom_id(ref_geom, geom0) == ref_geom_id(ref_geom, geom1)) {
      id = ref_geom_id(ref_geom, geom0);
      RSS(ref_cell_side_has_id(ref_grid_tri(ref_grid), node0, node1, id,
                               &has_id),
          "has edge id");
      if (has_id) {
        *needs_support = REF_TRUE;
        return REF_SUCCESS;
      }
    }
  }

  return REF_SUCCESS;
}